

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_specification.hpp
# Opt level: O3

void chaiscript::detail::Exception_Handler_Base::throw_type<std::exception_const&>
               (Boxed_Value *bv,Dispatch_Engine *t_engine)

{
  undefined8 *puVar1;
  Type_Conversions_State state;
  Type_Conversions_State local_20;
  
  local_20.m_saves._M_data = Type_Conversions::conversion_saves(&t_engine->m_conversions);
  local_20.m_conversions._M_data = &t_engine->m_conversions;
  boxed_cast<std::exception_const&>(bv,&local_20);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = std::istream::_M_extract<long_double>;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void throw_type(const Boxed_Value &bv, const Dispatch_Engine &t_engine) {
        try {
          T t = t_engine.boxed_cast<T>(bv);
          throw t;
        } catch (const chaiscript::exception::bad_boxed_cast &) {
        }
      }